

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O3

LightLeSample * __thiscall
pbrt::SpotLight::SampleLe
          (LightLeSample *__return_storage_ptr__,SpotLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  uintptr_t uVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  Float FVar21;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar22 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar23 [64];
  undefined1 auVar25 [56];
  undefined1 auVar24 [64];
  undefined1 auVar26 [16];
  undefined1 auVar28 [64];
  undefined1 auVar27 [16];
  undefined1 auVar30 [56];
  undefined1 auVar29 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float n2;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  SampledSpectrum SVar41;
  Float p [2];
  Tuple3<pbrt::Vector3,_float> local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c0 [2];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  Float local_8c;
  undefined8 local_88;
  undefined4 local_80;
  Tuple3<pbrt::Vector3,_float> local_7c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  Point3fi local_58;
  undefined1 local_40 [16];
  Interval<float> local_30;
  undefined1 extraout_var_01 [56];
  
  lVar11 = 0;
  local_c0[0] = 1.0 - this->cosFalloffStart;
  local_f8.x = 0.0;
  local_f8.y = 0.0;
  local_f8.z = 0.0;
  local_c0[1] = (this->cosFalloffStart - this->cosFalloffEnd) * 0.5;
  fVar36 = local_c0[0] + local_c0[1];
  fVar19 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  do {
    if (fVar19 < local_c0[lVar11] / fVar36) goto LAB_003cb50c;
    fVar19 = fVar19 - local_c0[lVar11] / fVar36;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 2);
  lVar11 = 2;
LAB_003cb50c:
  local_8c = time;
  if (SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg == '\0') {
    iVar10 = __cxa_guard_acquire(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
    if (iVar10 != 0) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg
                 ,SampleDiscrete(pstd::span<float_const>,float,float*,float*)::
                  {lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0);
      __cxa_guard_release(&SampleDiscrete(pstd::span<float_const>,float,float*,float*)::reg);
    }
  }
  *(long *)(in_FS_OFFSET + -0x370) = *(long *)(in_FS_OFFSET + -0x370) + 1;
  if (lVar11 == 2) {
    *(long *)(in_FS_OFFSET + -0x378) = *(long *)(in_FS_OFFSET + -0x378) + 1;
    local_a8._0_4_ = local_c0[1] / fVar36;
  }
  else {
    local_a8._0_4_ = local_c0[(int)lVar11] / fVar36;
    if ((int)lVar11 == 0) {
      fVar19 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
      fVar36 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(1.0 - fVar19)),ZEXT416((uint)fVar19),
                                ZEXT416((uint)this->cosFalloffStart));
      local_b8._0_4_ = (fVar36 + fVar36) * 3.1415927;
      auVar13 = vfnmadd213ss_fma(auVar14,auVar14,SUB6416(ZEXT464(0x3f800000),0));
      local_d8._0_4_ = auVar14._0_4_;
      auVar14 = vmaxss_avx(auVar13,ZEXT816(0) << 0x20);
      auVar14 = vsqrtss_avx(auVar14,auVar14);
      auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
      fVar19 = cosf((float)local_b8._0_4_);
      local_e8 = ZEXT416((uint)(fVar19 * auVar14._0_4_));
      fVar19 = sinf((float)local_b8._0_4_);
      uVar3 = vcmpss_avx512f(ZEXT416((uint)local_d8._0_4_),SUB6416(ZEXT464(0xbf800000),0),1);
      bVar12 = (bool)((byte)uVar3 & 1);
      auVar14 = vinsertps_avx(local_e8,ZEXT416((uint)(fVar19 * auVar14._0_4_)),0x10);
      auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_d8._0_4_));
      local_f8._0_8_ = vmovlps_avx(auVar14);
      local_f8.z = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar13._0_4_);
      fVar19 = (1.0 / ((1.0 - this->cosFalloffStart) * 6.2831855)) * (float)local_a8._0_4_;
      goto LAB_003cb8a1;
    }
  }
  fVar19 = this->cosFalloffEnd;
  auVar28 = ZEXT464((uint)fVar19);
  auVar14 = ZEXT416((uint)fVar19);
  fVar36 = this->cosFalloffStart;
  fVar34 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
  fVar2 = fVar36 - fVar19;
  fVar33 = (fVar19 - fVar19) / fVar2;
  fVar20 = fVar33 * fVar33;
  auVar13 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar20 * fVar20)),ZEXT416(0x40000000),
                                ZEXT416((uint)(fVar33 * fVar20)));
  fVar20 = auVar13._0_4_ - fVar34;
  auVar13._8_4_ = 0x7fffffff;
  auVar13._0_8_ = 0x7fffffff7fffffff;
  auVar13._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(ZEXT416((uint)fVar20),auVar13);
  bVar12 = 1e-06 < auVar13._0_4_;
  if (1e-06 <= auVar13._0_4_) {
    fVar35 = fVar2 / fVar2;
    fVar33 = fVar35 * fVar35;
    auVar13 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar33 * fVar33)),ZEXT416(0x40000000),
                                  ZEXT416((uint)(fVar35 * fVar33)));
    fVar33 = auVar13._0_4_ - fVar34;
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)fVar33),auVar37);
    fVar35 = auVar13._0_4_;
    bVar12 = 1e-06 < fVar35;
    if (1e-06 <= fVar35) {
      auVar37 = ZEXT816(0) << 0x40;
      auVar18 = ZEXT416((uint)fVar19);
      uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar20),auVar37,1);
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar39 = ZEXT464((uint)(fVar19 - (fVar20 * fVar2) / (fVar33 - fVar20)));
      auVar13 = vdivss_avx512f(ZEXT416(0x40000000),ZEXT416((uint)fVar2));
      auVar16 = ZEXT416((uint)fVar36);
      while( true ) {
        fVar20 = auVar16._0_4_;
        uVar4 = vcmpss_avx512f(auVar39._0_16_,auVar16,1);
        bVar5 = (bool)((byte)uVar4 & 1);
        auVar14 = vmulss_avx512f(ZEXT416((uint)(fVar20 + auVar18._0_4_)),
                                 SUB6416(ZEXT464(0x3f000000),0));
        auVar15._4_12_ = auVar14._4_12_;
        uVar4 = vcmpss_avx512f(auVar18,auVar39._0_16_,1);
        bVar6 = (bool)((byte)uVar4 & 1);
        auVar15._0_4_ =
             (uint)bVar6 * ((uint)bVar5 * auVar39._0_4_ + (uint)!bVar5 * auVar14._0_4_) +
             (uint)!bVar6 * auVar14._0_4_;
        auVar16 = vsubss_avx512f(auVar15,auVar28._0_16_);
        auVar14 = vucomiss_avx512f(auVar15);
        auVar28 = ZEXT1664(auVar14);
        auVar40._0_4_ = auVar16._0_4_ / fVar2;
        auVar40._4_12_ = auVar16._4_12_;
        fVar19 = 0.0;
        if ((bVar12 || fVar35 == 1e-06) &&
           (auVar15 = vucomiss_avx512f(ZEXT416((uint)fVar36)), bVar12 || fVar35 == 1e-06)) {
          fVar19 = 1.0;
          if ((auVar14._0_4_ != fVar36) || (NAN(auVar14._0_4_) || NAN(fVar36))) {
            uVar4 = vcmpss_avx512f(auVar40,auVar37,1);
            auVar16 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar40);
            fVar19 = (float)((uint)!(bool)((byte)uVar4 & 1) * auVar16._0_4_);
            auVar17._4_12_ = auVar16._4_12_;
            auVar17._0_4_ = fVar19;
            auVar16 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc0000000),0),auVar17,
                                          SUB6416(ZEXT464(0x40400000),0));
            auVar16 = vmulss_avx512f(ZEXT416((uint)(fVar19 * fVar19)),auVar16);
            fVar19 = auVar16._0_4_;
          }
          fVar19 = fVar19 * auVar13._0_4_;
        }
        fVar33 = auVar40._0_4_ * auVar40._0_4_;
        auVar16 = vfmsub231ss_avx512f(ZEXT416((uint)(fVar33 * fVar33)),
                                      ZEXT416((uint)(auVar40._0_4_ * fVar33)),ZEXT416(0x40000000));
        fVar33 = auVar16._0_4_ - fVar34;
        auVar16 = vandps_avx(ZEXT416((uint)fVar33),auVar38);
        bVar12 = 1e-06 < auVar16._0_4_;
        if (auVar16._0_4_ < 1e-06) break;
        uVar4 = vcmpps_avx512vl(ZEXT416((uint)fVar33),auVar37,5);
        bVar7 = (byte)uVar3 ^ (byte)uVar4;
        auVar16._4_12_ = auVar15._4_12_;
        auVar16._0_4_ =
             (float)((uint)(bVar7 & 1) * (int)fVar20 + (uint)!(bool)(bVar7 & 1) * auVar15._0_4_);
        auVar18._0_4_ =
             (float)((uint)(bVar7 & 1) * auVar15._0_4_ +
                    (uint)!(bool)(bVar7 & 1) * (int)auVar18._0_4_);
        fVar35 = auVar16._0_4_ - auVar18._0_4_;
        bVar12 = 1e-06 < fVar35;
        if (fVar35 < 1e-06) break;
        auVar14 = vsubss_avx512f(auVar15,ZEXT416((uint)(fVar33 / fVar19)));
        auVar39 = ZEXT1664(auVar14);
      }
    }
  }
  local_d8 = vucomiss_avx512f(auVar14);
  if ((bVar12) || (vucomiss_avx512f(local_d8), bVar12)) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x4f8,"Check failed: %s",
               (char (*) [57])"cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart");
  }
  auVar14 = vfnmadd213ss_avx512f(local_d8,local_d8,SUB6416(ZEXT464(0x3f800000),0));
  auVar14 = vmaxss_avx(auVar14,ZEXT816(0) << 0x40);
  fVar19 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  local_b8._0_4_ = (fVar19 + fVar19) * 3.1415927;
  auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar14);
  fVar19 = cosf((float)local_b8._0_4_);
  local_e8 = ZEXT416((uint)(fVar19 * auVar14._0_4_));
  fVar19 = sinf((float)local_b8._0_4_);
  fVar36 = 1.0;
  uVar3 = vcmpss_avx512f(local_d8,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar12 = (bool)((byte)uVar3 & 1);
  auVar14 = vinsertps_avx(local_e8,ZEXT416((uint)(fVar19 * auVar14._0_4_)),0x10);
  auVar13 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_d8);
  local_f8._0_8_ = vmovlps_avx(auVar14);
  local_f8.z = (float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar13._0_4_);
  fVar19 = this->cosFalloffEnd;
  fVar34 = local_d8._0_4_;
  if (fVar34 < fVar19) {
    fVar20 = 0.0;
  }
  else {
    fVar2 = this->cosFalloffStart;
    fVar20 = 0.0;
    if (fVar34 <= fVar2) {
      if ((fVar19 != fVar2) || (NAN(fVar19) || NAN(fVar2))) {
        auVar32._0_12_ = ZEXT812(0);
        auVar32._12_4_ = 0;
        auVar26._0_4_ = (fVar34 - fVar19) / (fVar2 - fVar19);
        auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
        uVar3 = vcmpss_avx512f(auVar26,auVar32,1);
        fVar36 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar14._0_4_);
        auVar14._0_4_ = fVar36;
        auVar14 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar14,ZEXT416(0x40400000));
        fVar36 = fVar36 * fVar36 * auVar14._0_4_;
      }
      fVar20 = (2.0 / (fVar2 - fVar19)) * fVar36;
    }
  }
  fVar19 = (fVar20 * (float)local_a8._0_4_) / 6.2831855;
LAB_003cb8a1:
  uVar1 = (this->super_LightBase).mediumInterface.outside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_88 = 0;
  local_80 = 0;
  local_7c.z = local_f8.z;
  local_7c.x = local_f8.x;
  local_7c.y = local_f8.y;
  uVar3 = local_7c._0_8_;
  local_7c.y = local_f8.y;
  local_e8._0_4_ = local_7c.y;
  local_40 = vmovlhps_avx(ZEXT816(0),ZEXT816(0));
  local_30 = (Interval<float>)vmovlps_avx(ZEXT816(0));
  local_7c.x = local_f8.x;
  local_a8._0_4_ = local_7c.x;
  local_d8._0_4_ = local_f8.z;
  local_7c._0_8_ = uVar3;
  Transform::operator()(&local_58,&(this->super_LightBase).renderFromLight,(Point3fi *)local_40);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[1][1])),
                            ZEXT416((uint)local_a8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[0][1])),
                            ZEXT416((uint)local_a8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][0]));
  auVar37 = vfmadd231ss_fma(ZEXT416((uint)((float)local_e8._0_4_ *
                                          (this->super_LightBase).renderFromLight.m.m[2][1])),
                            ZEXT416((uint)local_a8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  local_e8 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_d8._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]));
  auVar14 = vfmadd231ss_fma(auVar13,ZEXT416((uint)local_d8._0_4_),
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[0][2]));
  local_a8 = vfmadd231ss_fma(auVar37,ZEXT416((uint)local_d8._0_4_),
                             ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar27._0_12_ = ZEXT812(0);
  auVar27._12_4_ = 0;
  fVar36 = local_e8._0_4_;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar36 * fVar36)),auVar14,auVar14);
  auVar13 = vfmadd231ss_fma(auVar13,local_a8,local_a8);
  if (auVar13._0_4_ <= 0.0) {
    auVar22._8_8_ = 0;
    auVar22._0_4_ =
         local_58.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar22._4_4_ =
         local_58.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
  }
  else {
    auVar31._8_4_ = 0x7fffffff;
    auVar31._0_8_ = 0x7fffffff7fffffff;
    auVar31._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx(local_e8,auVar31);
    auVar18 = vandps_avx(auVar14,auVar31);
    auVar16 = vandps_avx(local_a8,auVar31);
    auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar37._0_4_ * 0.0)),auVar27,auVar18);
    auVar37 = vfmadd231ss_fma(auVar37,auVar27,auVar16);
    fVar20 = auVar37._0_4_ / auVar13._0_4_;
    fVar34 = auVar14._0_4_ * fVar20;
    _local_b8 = ZEXT416((uint)(local_a8._0_4_ * fVar20));
    i.high = fVar34;
    i.low = fVar34;
    _local_68 = ZEXT416((uint)(fVar36 * fVar20));
    local_d8 = auVar14;
    auVar28._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_58,i);
    auVar28._8_56_ = extraout_var;
    uVar3 = vmovlps_avx(auVar28._0_16_);
    local_58.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar3;
    local_58.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar3 >> 0x20);
    i_00.high = (float)local_68._0_4_;
    i_00.low = (float)local_68._0_4_;
    auVar39._0_8_ =
         Interval<float>::operator+<float>
                   (&local_58.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar39._8_56_ = extraout_var_00;
    uVar3 = vmovlps_avx(auVar39._0_16_);
    local_58.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar3;
    local_58.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar3 >> 0x20);
    i_01.high = (float)local_b8._0_4_;
    i_01.low = (float)local_b8._0_4_;
    auVar23._0_8_ =
         Interval<float>::operator+<float>
                   (&local_58.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar23._8_56_ = extraout_var_01;
    auVar22 = auVar23._0_16_;
    auVar14 = local_d8;
  }
  auVar13 = vhaddps_avx(auVar22,auVar22);
  auVar9._4_4_ = local_58.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar9._0_4_ = local_58.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar9._8_4_ = local_58.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar9._12_4_ =
       local_58.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar37 = vinsertps_avx(auVar9,ZEXT416((uint)local_58.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar30 = ZEXT856(auVar37._8_8_);
  local_d8._0_4_ = auVar13._0_4_ * 0.5;
  local_e8 = vinsertps_avx(auVar14,local_e8,0x10);
  local_b8._4_4_ =
       local_58.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar37._4_4_;
  local_b8._0_4_ =
       local_58.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar37._0_4_;
  fStack_b0 = auVar37._8_4_ + 0.0;
  fStack_ac = auVar37._12_4_ + 0.0;
  FVar21 = this->scale;
  local_68._4_4_ = FVar21;
  local_68._0_4_ = FVar21;
  fStack_60 = FVar21;
  fStack_5c = FVar21;
  auVar25 = ZEXT856(local_68._8_8_);
  SVar41 = DenselySampledSpectrum::Sample(&this->I,lambda);
  auVar29._0_8_ = SVar41.values.values._8_8_;
  auVar29._8_56_ = auVar30;
  auVar24._0_8_ = SVar41.values.values._0_8_;
  auVar24._8_56_ = auVar25;
  auVar14 = vmovlhps_avx(auVar24._0_16_,auVar29._0_16_);
  local_68._4_4_ = auVar14._4_4_ * (float)local_68._4_4_;
  local_68._0_4_ = auVar14._0_4_ * (float)local_68._0_4_;
  fStack_60 = auVar14._8_4_ * fStack_60;
  fStack_5c = auVar14._12_4_ * fStack_5c;
  FVar21 = Falloff(this,(Vector3f *)&local_f8);
  auVar8._8_4_ = 0x3f000000;
  auVar8._0_8_ = 0x3f0000003f000000;
  auVar8._12_4_ = 0x3f000000;
  auVar14 = vmulps_avx512vl(_local_b8,auVar8);
  (__return_storage_ptr__->L).values.values[0] = FVar21 * (float)local_68._0_4_;
  (__return_storage_ptr__->L).values.values[1] = FVar21 * (float)local_68._4_4_;
  (__return_storage_ptr__->L).values.values[2] = FVar21 * fStack_60;
  (__return_storage_ptr__->L).values.values[3] = FVar21 * fStack_5c;
  uVar3 = vmovlps_avx(auVar14);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_d8._0_4_;
  uVar3 = vmovlps_avx(local_e8);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar3;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar3 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_a8._0_4_;
  (__return_storage_ptr__->ray).time = local_8c;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = uVar1;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0;
  __return_storage_ptr__->pdfDir = fVar19;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample SpotLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                  SampledWavelengths &lambda, Float time) const {
    // Unnormalized probabilities of sampling each part.
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    Float sectionPDF;
    Vector3f wl;
    int section = SampleDiscrete(p, u2[0], &sectionPDF);
    Float pdfDir;
    if (section == 0) {
        // Sample center cone
        wl = SampleUniformCone(u1, cosFalloffStart);
        pdfDir = sectionPDF * UniformConePDF(cosFalloffStart);
    } else {
        DCHECK_EQ(1, section);

        Float cosTheta = SampleSmoothStep(u1[0], cosFalloffEnd, cosFalloffStart);
        CHECK(cosTheta >= cosFalloffEnd && cosTheta <= cosFalloffStart);
        Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
        Float phi = u1[1] * 2 * Pi;
        wl = SphericalDirection(sinTheta, cosTheta, phi);
        pdfDir = sectionPDF * SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) /
                 (2 * Pi);
    }

    Ray ray = renderFromLight(Ray(Point3f(0, 0, 0), wl, time, mediumInterface.outside));
    return LightLeSample(scale * I.Sample(lambda) * Falloff(wl), ray, 1, pdfDir);
}